

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.cpp
# Opt level: O0

COMPONENT_TYPE
Diligent::CheckSparseTextureFormatSupport
          (TEXTURE_FORMAT TexFormat,RESOURCE_DIMENSION Dimension,Uint32 SampleCount,
          SparseResourceProperties *SparseRes)

{
  bool bVar1;
  SPARSE_RESOURCE_CAP_FLAGS SVar2;
  Char *pCVar3;
  TextureFormatAttribs *pTVar4;
  uint *Args_1;
  undefined1 local_a0 [8];
  string msg_3;
  string msg_2;
  string msg_1;
  string msg;
  SparseResourceProperties *SparseRes_local;
  Uint32 SampleCount_local;
  RESOURCE_DIMENSION Dimension_local;
  TEXTURE_FORMAT TexFormat_local;
  
  Args_1 = &switchD_003bd13c::switchdataD_0048dac4;
  switch(Dimension) {
  case RESOURCE_DIM_BUFFER:
  case RESOURCE_DIM_TEX_1D:
  case RESOURCE_DIM_TEX_1D_ARRAY:
    FormatString<char[42]>
              ((string *)((long)&msg_3.field_2 + 8),
               (char (*) [42])"Invalid sparse texture resource dimension");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CheckSparseTextureFormatSupport",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderDeviceBase.cpp"
               ,0xb6);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    return COMPONENT_TYPE_UNDEFINED;
  case RESOURCE_DIM_TEX_2D:
  case RESOURCE_DIM_TEX_2D_ARRAY:
    SVar2 = operator&(SparseRes->CapFlags,SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D);
    if (SVar2 == SPARSE_RESOURCE_CAP_FLAG_NONE) {
      return COMPONENT_TYPE_UNDEFINED;
    }
    bVar1 = IsPowerOfTwo<unsigned_int>(SampleCount);
    if (!bVar1) {
      FormatString<char[26],char[26]>
                ((string *)((long)&msg_1.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"IsPowerOfTwo(SampleCount)",(char (*) [26])Args_1);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"CheckSparseTextureFormatSupport",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderDeviceBase.cpp"
                 ,0xa1);
      std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
    }
    if ((1 < SampleCount) &&
       ((SparseRes->CapFlags & (SampleCount >> 1) << 4) == SPARSE_RESOURCE_CAP_FLAG_NONE)) {
      return COMPONENT_TYPE_UNDEFINED;
    }
    break;
  case RESOURCE_DIM_TEX_3D:
    if (SampleCount != 1) {
      FormatString<char[41]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (char (*) [41])"Multisampled texture 3D is not supported");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"CheckSparseTextureFormatSupport",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderDeviceBase.cpp"
                 ,0xae);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    SVar2 = operator&(SparseRes->CapFlags,SPARSE_RESOURCE_CAP_FLAG_TEXTURE_3D);
    if (SVar2 == SPARSE_RESOURCE_CAP_FLAG_NONE) {
      return COMPONENT_TYPE_UNDEFINED;
    }
    break;
  case RESOURCE_DIM_TEX_CUBE:
  case RESOURCE_DIM_TEX_CUBE_ARRAY:
    SVar2 = operator&(SparseRes->CapFlags,SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D);
    if (SVar2 == SPARSE_RESOURCE_CAP_FLAG_NONE) {
      return COMPONENT_TYPE_UNDEFINED;
    }
    break;
  default:
    FormatString<char[30]>((string *)local_a0,(char (*) [30])"Unexpected resource dimension");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CheckSparseTextureFormatSupport",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderDeviceBase.cpp"
               ,0xba);
    std::__cxx11::string::~string((string *)local_a0);
    return COMPONENT_TYPE_UNDEFINED;
  }
  pTVar4 = GetTextureFormatAttribs(TexFormat);
  return pTVar4->ComponentType;
}

Assistant:

COMPONENT_TYPE CheckSparseTextureFormatSupport(TEXTURE_FORMAT                  TexFormat,
                                               RESOURCE_DIMENSION              Dimension,
                                               Uint32                          SampleCount,
                                               const SparseResourceProperties& SparseRes) noexcept
{
    switch (Dimension)
    {
        case RESOURCE_DIM_TEX_2D:
        case RESOURCE_DIM_TEX_2D_ARRAY:
        {
            if ((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D) == 0)
                return COMPONENT_TYPE_UNDEFINED;

            static_assert(SPARSE_RESOURCE_CAP_FLAG_TEXTURE_4_SAMPLES == SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2_SAMPLES * 2, "Unexpected enum values");
            static_assert(SPARSE_RESOURCE_CAP_FLAG_TEXTURE_8_SAMPLES == SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2_SAMPLES * 4, "Unexpected enum values");
            static_assert(SPARSE_RESOURCE_CAP_FLAG_TEXTURE_16_SAMPLES == SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2_SAMPLES * 8, "Unexpected enum values");
            VERIFY_EXPR(IsPowerOfTwo(SampleCount));
            if (SampleCount >= 2 && (SparseRes.CapFlags & (SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2_SAMPLES * (SampleCount >> 1))) == 0)
                return COMPONENT_TYPE_UNDEFINED;

            break;
        }
        case RESOURCE_DIM_TEX_CUBE:
        case RESOURCE_DIM_TEX_CUBE_ARRAY:
            if ((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D) == 0)
                return COMPONENT_TYPE_UNDEFINED;
            break;

        case RESOURCE_DIM_TEX_3D:
            DEV_CHECK_ERR(SampleCount == 1, "Multisampled texture 3D is not supported");
            if ((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_TEXTURE_3D) == 0)
                return COMPONENT_TYPE_UNDEFINED;
            break;

        case RESOURCE_DIM_BUFFER:
        case RESOURCE_DIM_TEX_1D:
        case RESOURCE_DIM_TEX_1D_ARRAY:
            DEV_ERROR("Invalid sparse texture resource dimension");
            return COMPONENT_TYPE_UNDEFINED;

        default:
            DEV_ERROR("Unexpected resource dimension");
            return COMPONENT_TYPE_UNDEFINED;
    }

    return GetTextureFormatAttribs(TexFormat).ComponentType;
}